

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

ActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ActionObservationHistoryTree *pAVar5;
  size_type sVar6;
  ActionObservationHistory *this_00;
  size_t sVar7;
  reference pvVar8;
  reference pvVar9;
  ostream *poVar10;
  uint in_ESI;
  PlanningUnit *in_RDI;
  Index nr_AOHI_for_ts;
  ActionObservationHistoryTree *next_aoht;
  ActionObservationHistory *next_aoh;
  Index oI;
  Index aI;
  Index nr_AOHI_for_ts_1;
  int thisLength;
  ActionObservationHistory *aoh;
  ActionObservationHistoryTree *aoht;
  Index ts;
  ActionObservationHistoryTree *root;
  ActionObservationHistory *aoh_0;
  size_t nrO;
  size_t nrA;
  size_t maxLength;
  Index aohI;
  queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  aohtQueue;
  undefined4 in_stack_fffffffffffffe48;
  Index in_stack_fffffffffffffe4c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  ActionObservationHistoryTree *in_stack_fffffffffffffe60;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe68;
  ActionObservationHistoryTree *in_stack_fffffffffffffe70;
  void *in_stack_fffffffffffffe78;
  ActionObservationHistoryTree *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffea0;
  Index in_stack_fffffffffffffea4;
  ActionObservationHistory *this_01;
  uint local_e0;
  uint local_dc;
  uint local_a4;
  int local_64;
  
  std::
  queue<ActionObservationHistoryTree*,std::deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>>
  ::
  queue<std::deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>,void>
            ((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
              *)in_stack_fffffffffffffe50);
  local_64 = 0;
  sVar3 = PlanningUnit::GetHorizon(in_RDI);
  iVar1 = (*in_RDI->_vptr_PlanningUnit[7])(in_RDI,(ulong)in_ESI);
  sVar4 = GetNrObservations(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  operator_new(0x30);
  ActionObservationHistory::ActionObservationHistory
            ((ActionObservationHistory *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (Index)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  pAVar5 = (ActionObservationHistoryTree *)operator_new(0x60);
  ActionObservationHistoryTree::ActionObservationHistoryTree
            (in_stack_fffffffffffffe60,
             (ActionObservationHistory *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (aoh_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  std::
  queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  ::push((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
          *)in_stack_fffffffffffffe50,
         (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_a4 = 0;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)&in_RDI[10]._m_problem,(ulong)in_ESI);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffe50,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  while (sVar6 = std::
                 queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                 ::size((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                         *)0x9d4e16), sVar6 != 0) {
    std::
    queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
    ::front((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
             *)0x9d4e39);
    this_00 = ActionObservationHistoryTree::GetActionObservationHistory(in_stack_fffffffffffffe60);
    this_01 = this_00;
    std::
    queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
    ::pop((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
           *)0x9d4e7e);
    sVar7 = History::GetLength((History *)this_00);
    uVar2 = (uint)sVar7;
    if (local_a4 != uVar2) {
      in_stack_fffffffffffffea0 = local_64;
      pvVar8 = std::
               vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                             *)&in_RDI[10]._m_problem,(ulong)in_ESI);
      pvVar9 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (pvVar8,(ulong)local_a4);
      in_stack_fffffffffffffea4 = Globals::CastLIndexToIndex(*pvVar9);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 9),(ulong)in_ESI);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_a4 = local_a4 + 1;
      if (local_a4 != uVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "ERROR: CreateActionObservationHistories:  ++ts != ");
        poVar10 = std::operator<<(poVar10,"(Index) thisLength !!! ts (now) is: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_a4);
        in_stack_fffffffffffffe80 =
             (ActionObservationHistoryTree *)std::operator<<(poVar10,"thisLength-1  =");
        in_stack_fffffffffffffe78 =
             (void *)std::ostream::operator<<(in_stack_fffffffffffffe80,uVar2 - 1);
        std::ostream::operator<<(in_stack_fffffffffffffe78,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                    *)&in_RDI[10]._m_problem,(ulong)in_ESI);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 in_stack_fffffffffffffe50,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    local_64 = local_64 + 1;
    ActionObservationHistoryTree::SetIndex
              (in_stack_fffffffffffffe70,(Index)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    std::
    vector<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
    ::operator[]((vector<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
                  *)(in_RDI + 0x10),(ulong)in_ESI);
    std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>::
    push_back((vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
               *)in_stack_fffffffffffffe60,
              (value_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    in_stack_fffffffffffffe70 =
         (ActionObservationHistoryTree *)History::GetLength((History *)this_00);
    if (in_stack_fffffffffffffe70 < (ActionObservationHistoryTree *)(sVar3 - 1)) {
      for (local_dc = 0; (ulong)local_dc < CONCAT44(extraout_var,iVar1); local_dc = local_dc + 1) {
        for (local_e0 = 0; local_e0 < sVar4; local_e0 = local_e0 + 1) {
          in_stack_fffffffffffffe68 = (PlanningUnitMADPDiscrete *)operator_new(0x30);
          ActionObservationHistory::ActionObservationHistory
                    (this_01,(Index)(sVar7 >> 0x20),(Index)sVar7,
                     (ActionObservationHistory *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          in_stack_fffffffffffffe60 = (ActionObservationHistoryTree *)operator_new(0x60);
          ActionObservationHistoryTree::ActionObservationHistoryTree
                    (in_stack_fffffffffffffe60,
                     (ActionObservationHistory *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (aoh_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          ActionObservationHistoryTree::SetSuccessor
                    (in_stack_fffffffffffffe80,(Index)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (Index)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          std::
          queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
          ::push((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
                  *)in_stack_fffffffffffffe50,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
    }
  }
  pvVar8 = std::
           vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                         *)&in_RDI[10]._m_problem,(ulong)in_ESI);
  pvVar9 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (pvVar8,(ulong)local_a4);
  Globals::CastLIndexToIndex(*pvVar9);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 9),(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::
  queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  ::~queue((queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
            *)0x9d5372);
  return pAVar5;
}

Assistant:

ActionObservationHistoryTree* PlanningUnitMADPDiscrete::
    CreateActionObservationHistoryTree(Index agentI)
{
    queue<ActionObservationHistoryTree*> aohtQueue;
    
    Index aohI = 0;
    size_t maxLength = GetHorizon() - 1;
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);

    //initial ActionObservationHistory aoh_0
    ActionObservationHistory* aoh_0 =new ActionObservationHistory(*this,agentI);
    ActionObservationHistoryTree* root =new ActionObservationHistoryTree(aoh_0);

    aohtQueue.push(root);

    Index ts = 0;
    _m_firstAOHIforT[agentI].push_back(aohI);
    while(aohtQueue.size() >= 1)
    {
        //  aoh = queue.pop
        ActionObservationHistoryTree* aoht = aohtQueue.front();
        ActionObservationHistory* aoh = aoht->GetActionObservationHistory();
        aohtQueue.pop();

        int thisLength = aoh->GetLength(); 
        if(ts != (Index) thisLength  ) //length 0 <-> ts 0 
        {
            // we've now started processing AOHs for the next ts
            Index nr_AOHI_for_ts = aohI - 
                CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
#if DEBUG_PUDCAOHT
            cout << "First aoh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstAOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAOHIforT[agentI][ts] << ", current AOHI = " <<
                aohI << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts); 
#if DEBUG_PUDCAOHT
            cout << 
                "Set _m_nrActionObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AOHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength-1  =" << thisLength-1 <<endl;            
            _m_firstAOHIforT[agentI].push_back(aohI);            
        }
        //  aoh.SetIndex(index++)
        aoht->SetIndex(aohI++);        
        _m_actionObservationHistoryTreeVectors[agentI].push_back(aoht);
        
        if(aoh->GetLength() >= maxLength )
            //this is a final action-obs history:
            continue;
        //else

        for(Index aI = 0; aI < nrA; aI++)
            for(Index oI = 0; oI < nrO; oI++)
            {
                //Constructor gets act. and obs. history and extends them
                //with aI, oI. to find new ones,
                ActionObservationHistory* next_aoh =
                    new ActionObservationHistory(aI, oI, aoh);
#if DEBUG_PUDCAOHT
                cout << "created new aoh (for aI="<<aI<<", oI="<<oI<<":"<<
                    endl; 
                next_aoh->Print();
                cout << endl;
#endif

                ActionObservationHistoryTree* next_aoht =
                    new ActionObservationHistoryTree(next_aoh);
#if DEBUG_PUDCAOHT
                cout << "\ncreated new aoh tree:"<<endl; 
                next_aoht->Print();
                cout << endl;
#endif

                aoht->SetSuccessor(aI, oI, next_aoht);
                aohtQueue.push(next_aoht);
            }

    }
    Index nr_AOHI_for_ts = aohI - CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
    _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts);
    _m_nrActionObservationHistories.push_back(aohI);

    return(root);
}